

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_reshape_before_binaryop(NetOptimize *this)

{
  int iVar1;
  int iVar2;
  value_type pLVar3;
  value_type pLVar4;
  bool bVar5;
  size_type sVar6;
  reference ppLVar7;
  reference pvVar8;
  size_type sVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  undefined8 uVar10;
  reference pvVar11;
  const_iterator in_RDI;
  int bottom_blob_index_final;
  BinaryOp *binaryop;
  int j;
  int top_blob_index;
  Reshape *reshape;
  int i;
  size_t layer_count;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  FILE *__stream;
  int local_28;
  int local_14;
  
  sVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                     (in_RDI._M_current + 0x10));
  local_14 = 0;
  do {
    if (sVar6 <= (ulong)(long)local_14) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI._M_current + 0x10),
               (long)local_14);
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (char *)in_stack_ffffffffffffff78);
    if (!bVar5) {
      ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                           (in_RDI._M_current + 0x10),(long)local_14);
      pLVar3 = *ppLVar7;
      if (((*(int *)&pLVar3[1]._vptr_Layer == 1) &&
          (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 1)) &&
         (*(int *)&pLVar3[1].support_bf16_storage == 0)) {
        ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI._M_current + 0x10),(long)local_14);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->tops,0);
        iVar1 = *pvVar8;
        local_28 = local_14;
        do {
          do {
            do {
              local_28 = local_28 + 1;
              if (sVar6 <= (ulong)(long)local_28) goto LAB_00121934;
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                         (in_RDI._M_current + 0x10),(long)local_28);
              bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80),
                                      (char *)in_stack_ffffffffffffff78);
            } while (bVar5);
            ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI._M_current + 0x10),(long)local_28);
            sVar9 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar7)->bottoms);
          } while (sVar9 != 2);
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI._M_current + 0x10),(long)local_28);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
          if (*pvVar8 == iVar1) break;
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI._M_current + 0x10),(long)local_28);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,1);
        } while (*pvVar8 != iVar1);
LAB_00121934:
        if ((long)local_28 != sVar6) {
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI._M_current + 0x10),(long)local_28);
          pLVar4 = *ppLVar7;
          __stream = _stderr;
          __last._M_current = (int *)std::__cxx11::string::c_str();
          uVar10 = std::__cxx11::string::c_str();
          fprintf(__stream,"eliminate_reshape_before_binaryop %s %s\n",__last._M_current,uVar10);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->bottoms,0);
          iVar2 = *pvVar8;
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI._M_current + 0x10),(long)local_28);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,0);
          if (*pvVar8 == iVar1) {
            in_stack_ffffffffffffff84 = iVar2;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->bottoms,0);
            *pvVar8 = in_stack_ffffffffffffff84;
          }
          ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI._M_current + 0x10),(long)local_28);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar7)->bottoms,1);
          if (*pvVar8 == iVar1) {
            in_stack_ffffffffffffff80 = iVar2;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->bottoms,1);
            *pvVar8 = in_stack_ffffffffffffff80;
          }
          pvVar11 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                               (in_RDI._M_current + 10),(long)iVar2);
          in_stack_ffffffffffffff78 = &pvVar11->consumers;
          std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                    ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI._M_current + 10),
                     (long)iVar2);
          std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
          std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                    ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI._M_current + 10),
                     (long)iVar2);
          std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
          std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     in_RDI._M_current,__last,&__stream->_flags);
          __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
          __normal_iterator<int*>
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff78);
          std::vector<int,_std::allocator<int>_>::erase
                    ((vector<int,_std::allocator<int>_> *)__last._M_current,in_RDI);
          std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                    ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI._M_current + 10),
                     (long)iVar2);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)__last._M_current,&__stream->_flags);
          std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
        }
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_reshape_before_binaryop()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Reshape")
            continue;

        ncnn::Reshape* reshape = (ncnn::Reshape*)layers[i];
        if (reshape->w != 1 || reshape->h != 1 || reshape->permute != 0)
            continue;

        // Reshape - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index || layers[j]->bottoms[1] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        fprintf(stderr, "eliminate_reshape_before_binaryop %s %s\n", reshape->name.c_str(), binaryop->name.c_str());

        int bottom_blob_index_final = reshape->bottoms[0];
        if (layers[j]->bottoms[0] == top_blob_index)
            binaryop->bottoms[0] = bottom_blob_index_final;
        if (layers[j]->bottoms[1] == top_blob_index)
            binaryop->bottoms[1] = bottom_blob_index_final;
        blobs[bottom_blob_index_final].consumers.erase(std::find(blobs[bottom_blob_index_final].consumers.begin(), blobs[bottom_blob_index_final].consumers.end(), i));
        blobs[bottom_blob_index_final].consumers.push_back(j);
        reshape->type = "ncnnfused";
    }

    return 0;
}